

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O0

void __thiscall asmjit::_abi_1_10::a64::ARMRAPass::onInit(ARMRAPass *this)

{
  BaseReg *pBVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint regId;
  uint uVar5;
  ArchTraits *pAVar6;
  uint32_t *puVar7;
  uchar *puVar8;
  ARMRAPass *in_RDI;
  bool hasFP;
  Arch arch;
  undefined7 in_stack_ffffffffffffffa8;
  RegGroup in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint32_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  RegGroup RVar9;
  uint32_t local_28;
  undefined1 local_21;
  uint32_t local_20;
  undefined1 local_19;
  uint32_t local_18;
  undefined1 local_11;
  uint32_t local_10;
  Arch local_9;
  
  RVar9 = (RegGroup)((uint)in_stack_ffffffffffffffbc >> 0x18);
  cc(in_RDI);
  local_9 = BaseEmitter::arch((BaseEmitter *)0x1727f0);
  (in_RDI->_emitHelper).super_BaseEmitHelper._emitter =
       &((in_RDI->super_BaseRAPass).super_FuncPass.super_Pass._cb)->super_BaseEmitter;
  pAVar6 = ArchTraits::byArch(local_9);
  (in_RDI->super_BaseRAPass)._archTraits = pAVar6;
  RARegCount::set((RARegCount *)in_RDI,RVar9,in_stack_ffffffffffffffb8);
  RARegCount::set((RARegCount *)in_RDI,RVar9,in_stack_ffffffffffffffb8);
  RARegCount::set((RARegCount *)in_RDI,RVar9,in_stack_ffffffffffffffb8);
  RARegCount::set((RARegCount *)in_RDI,RVar9,in_stack_ffffffffffffffb8);
  BaseRAPass::_buildPhysIndex
            ((BaseRAPass *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  (in_RDI->super_BaseRAPass)._availableRegCount.field_0 =
       (in_RDI->super_BaseRAPass)._physRegCount.field_0;
  local_10 = RARegCount::get((RARegCount *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffaf);
  uVar3 = Support::lsbMask<unsigned_int,unsigned_int>(&local_10);
  local_11 = 0;
  puVar7 = RARegMask::operator[]<asmjit::_abi_1_10::RegGroup>
                     ((RARegMask *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),
                      (RegGroup *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  *puVar7 = uVar3;
  local_18 = RARegCount::get((RARegCount *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),
                             in_stack_ffffffffffffffaf);
  uVar4 = Support::lsbMask<unsigned_int,unsigned_int>(&local_18);
  local_19 = 1;
  puVar7 = RARegMask::operator[]<asmjit::_abi_1_10::RegGroup>
                     ((RARegMask *)CONCAT44(uVar4,uVar3),
                      (RegGroup *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  *puVar7 = uVar4;
  local_20 = RARegCount::get((RARegCount *)CONCAT44(uVar4,uVar3),in_stack_ffffffffffffffaf);
  regId = Support::lsbMask<unsigned_int,unsigned_int>(&local_20);
  local_21 = 3;
  puVar7 = RARegMask::operator[]<asmjit::_abi_1_10::RegGroup>
                     ((RARegMask *)CONCAT44(uVar4,uVar3),
                      (RegGroup *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  *puVar7 = regId;
  local_28 = RARegCount::get((RARegCount *)CONCAT44(uVar4,uVar3),in_stack_ffffffffffffffaf);
  uVar5 = Support::lsbMask<unsigned_int,unsigned_int>(&local_28);
  puVar7 = RARegMask::operator[]<asmjit::_abi_1_10::RegGroup>
                     ((RARegMask *)CONCAT44(uVar4,uVar3),
                      (RegGroup *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  *puVar7 = uVar5;
  puVar8 = Support::Array<unsigned_char,_2UL>::operator[]<int>
                     ((Array<unsigned_char,_2UL> *)CONCAT44(uVar4,uVar3),
                      (int *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  RVar9 = (RegGroup)(uVar5 >> 0x18);
  *puVar8 = '\x1b';
  puVar8 = Support::Array<unsigned_char,_2UL>::operator[]<int>
                     ((Array<unsigned_char,_2UL> *)CONCAT44(uVar4,uVar3),
                      (int *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  *puVar8 = '\x1c';
  FuncNode::frame((in_RDI->super_BaseRAPass)._func);
  bVar2 = FuncFrame::hasPreservedFP((FuncFrame *)0x172a0f);
  if (bVar2) {
    BaseRAPass::makeUnavailable(&in_RDI->super_BaseRAPass,RVar9,regId);
  }
  BaseRAPass::makeUnavailable(&in_RDI->super_BaseRAPass,RVar9,regId);
  BaseRAPass::makeUnavailable(&in_RDI->super_BaseRAPass,RVar9,regId);
  (in_RDI->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature = 0x8000039;
  (in_RDI->super_BaseRAPass)._sp.super_Operand.super_Operand_._baseId = 0x1f;
  pBVar1 = &(in_RDI->super_BaseRAPass)._sp;
  (pBVar1->super_Operand).super_Operand_._data[0] = 0;
  (pBVar1->super_Operand).super_Operand_._data[1] = 0;
  (in_RDI->super_BaseRAPass)._fp.super_Operand.super_Operand_._signature = 0x8000039;
  (in_RDI->super_BaseRAPass)._fp.super_Operand.super_Operand_._baseId = 0x1d;
  pBVar1 = &(in_RDI->super_BaseRAPass)._fp;
  (pBVar1->super_Operand).super_Operand_._data[0] = 0;
  (pBVar1->super_Operand).super_Operand_._data[1] = 0;
  return;
}

Assistant:

void ARMRAPass::onInit() noexcept {
  Arch arch = cc()->arch();

  _emitHelper._emitter = _cb;

  _archTraits = &ArchTraits::byArch(arch);
  _physRegCount.set(RegGroup::kGp, 32);
  _physRegCount.set(RegGroup::kVec, 32);
  _physRegCount.set(RegGroup::kExtraVirt2, 0);
  _physRegCount.set(RegGroup::kExtraVirt3, 0);
  _buildPhysIndex();

  _availableRegCount = _physRegCount;
  _availableRegs[RegGroup::kGp] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kGp));
  _availableRegs[RegGroup::kVec] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kVec));
  _availableRegs[RegGroup::kExtraVirt3] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kExtraVirt2));
  _availableRegs[RegGroup::kExtraVirt3] = Support::lsbMask<uint32_t>(_physRegCount.get(RegGroup::kExtraVirt3));

  _scratchRegIndexes[0] = uint8_t(27);
  _scratchRegIndexes[1] = uint8_t(28);

  // The architecture specific setup makes implicitly all registers available. So
  // make unavailable all registers that are special and cannot be used in general.
  bool hasFP = _func->frame().hasPreservedFP();

  if (hasFP)
    makeUnavailable(RegGroup::kGp, Gp::kIdFp);

  makeUnavailable(RegGroup::kGp, Gp::kIdSp);
  makeUnavailable(RegGroup::kGp, Gp::kIdOs); // OS-specific use, usually TLS.

  _sp = sp;
  _fp = x29;
}